

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  int iVar1;
  uint uVar2;
  ai_uint32 aVar3;
  FormatVersion FVar4;
  undefined4 extraout_var;
  Logger *pLVar5;
  undefined4 extraout_var_00;
  ostream *poVar6;
  char *__s;
  size_t sVar7;
  char *message;
  aiString v;
  char *local_460;
  long *local_458;
  long local_448 [2];
  aiString local_438;
  undefined4 extraout_var_01;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar1 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"COLLADA");
        if (iVar1 == 0) {
          uVar2 = TestAttribute(this,"version");
          if (uVar2 != 0xffffffff) {
            iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
            __s = (char *)CONCAT44(extraout_var_01,iVar1);
            local_438.length = 0;
            local_438.data[0] = '\0';
            memset(local_438.data + 1,0x1b,0x3ff);
            sVar7 = strlen(__s);
            aVar3 = (ai_uint32)sVar7;
            if ((int)aVar3 < 0x400) {
              local_438.length = aVar3;
              memcpy(local_438.data,__s,(long)(int)aVar3);
              local_438.data[(int)aVar3] = '\0';
            }
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
            ::_M_emplace_unique<char_const(&)[26],aiString&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                        *)&this->mAssetMetaData,(char (*) [26])"SourceAsset_FormatVersion",
                       &local_438);
            if (*__s == '1') {
              if (__s[1] == '.') {
                FVar4 = FV_1_5_n;
                message = "Collada schema version is 1.5.n";
                if (__s[2] != '5') goto LAB_0041e6a5;
LAB_0041e6d5:
                this->mFormat = FVar4;
                pLVar5 = DefaultLogger::get();
                Logger::debug(pLVar5,message);
              }
              else {
LAB_0041e6a5:
                if (__s[1] == '.') {
                  FVar4 = FV_1_4_n;
                  message = "Collada schema version is 1.4.n";
                  if (__s[2] == '4') goto LAB_0041e6d5;
                }
                if (__s[1] == '.') {
                  FVar4 = FV_1_3_n;
                  message = "Collada schema version is 1.3.n";
                  if (__s[2] == '3') goto LAB_0041e6d5;
                }
              }
            }
          }
          ReadStructure(this);
        }
        else {
          pLVar5 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[26]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_438,(char (*) [26])"Ignoring global element <");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          local_460 = (char *)CONCAT44(extraout_var_00,iVar1);
          poVar6 = (ostream *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_438,&local_460);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,">.",2);
          std::__cxx11::stringbuf::str();
          Logger::debug(pLVar5,(char *)local_458);
          if (local_458 != local_448) {
            operator_delete(local_458,local_448[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
          std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
          SkipElement(this);
        }
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    // Store declared format version string
                    aiString v;
                    v.Set(version);
                    mAssetMetaData.emplace(AI_METADATA_SOURCE_FORMAT_VERSION, v );

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}